

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O1

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,char *name,bool quiet)

{
  std::ios_base::ios_base((ios_base *)&(this->super_ofstream).field_0x140);
  *(code **)&(this->super_ofstream).field_0x140 = std::__cxx11::string::string;
  *(undefined8 *)&this->field_0x218 = 0;
  *(undefined2 *)&this->field_0x220 = 0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(undefined8 *)&this->field_0x230 = 0;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined8 *)&this->field_0x240 = 0;
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x5b53e8;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x5b5410;
  std::ofstream::ofstream
            (this,(char *)&PTR_construction_vtable_24__005b5428,
             (_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x118);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x5b53e8;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x5b5410;
  if (((this->super_ofstream).field_0x160 & 5) != 0 && !quiet) {
    cmSystemTools::Error
              ("Cannot open file for write: ",*(char **)&(this->super_ofstream).field_0x118,
               (char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(const char* name, bool quiet):
  cmGeneratedFileStreamBase(name),
  Stream(TempName.c_str())
{
  // Check if the file opened.
  if(!*this && !quiet)
    {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
    }
}